

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

void __thiscall
rtosc::MidiMapperRT::handleCC(MidiMapperRT *this,int par,int val,char chan,bool isNrpn)

{
  MidiMapperStorage *this_00;
  char cVar1;
  bool bVar2;
  uint ID;
  undefined7 in_register_00000081;
  uint uVar3;
  function<void_(const_char_*)> fStack_448;
  char msg [1024];
  
  cVar1 = '\x01';
  if ('\x01' < chan) {
    cVar1 = chan;
  }
  ID = (int)CONCAT71(in_register_00000081,isNrpn) * 0x40000 + par +
       (uint)(cVar1 - 1U & 0xf) * 0x4000;
  this_00 = this->storage;
  if (this_00 != (MidiMapperStorage *)0x0) {
    std::function<void_(const_char_*)>::function(&fStack_448,&this->backend);
    bVar2 = MidiMapperStorage::handleCC(this_00,ID,val,&fStack_448);
    if (bVar2) goto LAB_0011199f;
  }
  bVar2 = PendingQueue::has(&this->pending,ID);
  if (!bVar2) {
    uVar3 = this->watchSize;
    if (this_00 == (MidiMapperStorage *)0x0) {
      if (uVar3 == 0) {
        return;
      }
    }
    else {
      std::_Function_base::~_Function_base(&fStack_448.super__Function_base);
      if (uVar3 == 0) {
        return;
      }
      uVar3 = this->watchSize;
    }
    this->watchSize = uVar3 - 1;
    PendingQueue::insert(&this->pending,ID);
    rtosc_message(msg,0x400,"/midi-use-CC","i",(ulong)ID);
    std::function<void_(const_char_*)>::operator()(&this->frontend,msg);
    return;
  }
  if (this_00 == (MidiMapperStorage *)0x0) {
    return;
  }
LAB_0011199f:
  std::_Function_base::~_Function_base(&fStack_448.super__Function_base);
  return;
}

Assistant:

void MidiMapperRT::handleCC(int par, int val, char chan, bool isNrpn) {
    
    if(chan<1) chan=1;
    int ID = (isNrpn<<18) + (((chan-1)&0x0f)<<14) + par;
    //printf("handling CC(%d,%d){%d,%d,%d}\n", ID, val, (int)storage, pending.has(ID), watchSize);
    if((!storage || !storage->handleCC(ID, val, backend)) && !pending.has(ID) && watchSize) {
        watchSize--;
        pending.insert(ID);
        char msg[1024];
        rtosc_message(msg, 1024, "/midi-use-CC", "i", ID);
        frontend(msg);
    }
}